

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O2

void mxx::impl::
     distribute_scatter<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> out,
               size_t total_size,comm *comm)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  size_t recv_size;
  size_t recv_size_00;
  pair<unsigned_long,_int> pVar7;
  allocator_type local_5d;
  int root;
  int *local_58;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_sizes;
  
  local_size = (long)end._M_current - (long)begin._M_current >> 2;
  local_58 = out._M_current;
  pVar7 = max_element<unsigned_long>(&local_size,comm);
  root = pVar7.second;
  bVar3 = all_same<int>(&root,comm);
  if (!bVar3) {
    assert_fail("mxx::all_same(root, comm)",
                "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/distribution.hpp"
                ,0x42,"distribute_scatter");
  }
  uVar5 = comm->m_size;
  uVar1 = (ulong)uVar5;
  uVar2 = (ulong)uVar5;
  recv_size_00 = total_size / uVar1 + (ulong)((ulong)(uint)comm->m_rank < total_size % uVar2);
  if (comm->m_rank == root) {
    if (local_size != total_size) {
      assert_fail("local_size == total_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/distribution.hpp"
                  ,0x47,"distribute_scatter");
      uVar5 = comm->m_size;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&send_sizes,(long)(int)uVar5,&local_5d);
    uVar6 = 0;
    uVar4 = (ulong)(uint)comm->m_size;
    if (comm->m_size < 1) {
      uVar4 = uVar6;
    }
    for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      send_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6] =
           total_size / uVar1 + (ulong)(uVar6 < total_size % uVar2);
    }
    scatterv<int>(begin._M_current,&send_sizes,local_58,recv_size_00,root,comm);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&send_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  else {
    scatterv_recv<int>(local_58,recv_size_00,root,comm);
  }
  return;
}

Assistant:

void distribute_scatter(_InIterator begin, _InIterator end, _OutIterator out, size_t total_size, const mxx::comm& comm) {
        size_t local_size = std::distance(begin, end);
        // get root
        std::pair<size_t, int> max_pos = mxx::max_element(local_size, comm);
        int root = max_pos.second;
        MXX_ASSERT(mxx::all_same(root, comm));
        blk_dist part(total_size, comm.size(), comm.rank());


        if (comm.rank() == root) {
            MXX_ASSERT(local_size == total_size);
            // use scatterv to send
            std::vector<size_t> send_sizes(comm.size());
            for (int i = 0; i < comm.size(); ++i) {
                send_sizes[i] = part.local_size(i);
            }
            // TODO: scatterv with iterators rather than pointers
            mxx::scatterv(&(*begin), send_sizes, &(*out), part.local_size(), root, comm);
        } else {
            // use scatterv to receive
            size_t recv_size = part.local_size();
            mxx::scatterv_recv(&(*out), recv_size, root, comm);
        }
    }